

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

bool __thiscall
wasm::anon_unknown_18::Inlining::isUnderSizeLimit(Inlining *this,Name target,Name source)

{
  Index IVar1;
  mapped_type *pmVar2;
  Index MaxCombinedBinarySize;
  double estimatedBinarySize;
  Index combinedSize;
  Inlining *this_local;
  Name source_local;
  Name target_local;
  
  source_local.super_IString.str._M_len = source.super_IString.str._M_str;
  this_local = source.super_IString.str._M_len;
  source_local.super_IString.str._M_str = target.super_IString.str._M_len;
  pmVar2 = std::
           unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
           ::operator[](&this->infos,(key_type *)&source_local.super_IString.str._M_str);
  IVar1 = pmVar2->size;
  pmVar2 = std::
           unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
           ::operator[](&this->infos,(key_type *)&this_local);
  return (double)(IVar1 + pmVar2->size) * 2.5 < 409600.0;
}

Assistant:

bool isUnderSizeLimit(Name target, Name source) {
    // Estimate the combined binary size from the number of instructions.
    auto combinedSize = infos[target].size + infos[source].size;
    auto estimatedBinarySize = Measurer::BytesPerExpr * combinedSize;
    // The limit is arbitrary, but based on the links above. It is a very high
    // value that should appear very rarely in practice (for example, it does
    // not occur on the Emscripten benchmark suite of real-world codebases).
    const Index MaxCombinedBinarySize = 400 * 1024;
    return estimatedBinarySize < MaxCombinedBinarySize;
  }